

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedCompanion.cc
# Opt level: O3

void __thiscall Glucose::SharedCompanion::SharedCompanion(SharedCompanion *this,int _nbThreads)

{
  SolverCompanion::SolverCompanion(&this->super_SolverCompanion);
  ClausesBuffer::ClausesBuffer(&this->clausesBuffer);
  this->nbThreads = _nbThreads;
  this->bjobFinished = false;
  this->jobFinishedBy = (ParallelSolver *)0x0;
  this->panicMode = false;
  this->jobStatus = '\x02';
  (this->nextUnit).data = (int *)0x0;
  (this->nextUnit).sz = 0;
  (this->nextUnit).cap = 0;
  (this->unitLit).data = (Lit *)0x0;
  (this->unitLit).sz = 0;
  (this->unitLit).cap = 0;
  (this->isUnary).data = (lbool *)0x0;
  (this->isUnary).sz = 0;
  (this->isUnary).cap = 0;
  this->random_seed = 9164825.0;
  pthread_mutex_init((pthread_mutex_t *)&this->mutexSharedClauseCompanion,(pthread_mutexattr_t *)0x0
                    );
  pthread_mutex_init((pthread_mutex_t *)&this->mutexSharedUnitCompanion,(pthread_mutexattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&this->mutexSharedCompanion,(pthread_mutexattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&this->mutexJobFinished,(pthread_mutexattr_t *)0x0);
  if (0 < _nbThreads) {
    this->nbThreads = _nbThreads;
    ClausesBuffer::setNbThreads(&this->clausesBuffer,_nbThreads);
    fprintf(_stdout,
            "c Shared companion initialized: handling of clauses of %d threads.\nc %d ints for the sharing clause buffer (not expandable) .\n"
            ,_nbThreads,(ulong)(this->clausesBuffer).maxsize);
    return;
  }
  return;
}

Assistant:

SharedCompanion::SharedCompanion(int _nbThreads) :
    nbThreads(_nbThreads), 
    bjobFinished(false),
    jobFinishedBy(NULL),
    panicMode(false), // The bug in the SAT2014 competition :)
    jobStatus(l_Undef),
    random_seed(9164825) {

	pthread_mutex_init(&mutexSharedClauseCompanion,NULL); // This is the shared companion lock
	pthread_mutex_init(&mutexSharedUnitCompanion,NULL); // This is the shared companion lock
	pthread_mutex_init(&mutexSharedCompanion,NULL); // This is the shared companion lock
	pthread_mutex_init(&mutexJobFinished,NULL); // This is the shared companion lock
	if (_nbThreads> 0)  {
	    setNbThreads(_nbThreads);
	    fprintf(stdout,"c Shared companion initialized: handling of clauses of %d threads.\nc %d ints for the sharing clause buffer (not expandable) .\n", _nbThreads, clausesBuffer.maxSize());
	}

}